

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O0

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>
::~io_op(io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>
         *this)

{
  io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>
  *this_local;
  
  SL::WS_LITE::
  async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::$_0::~__0((__0 *)&this->handler_);
  return;
}

Assistant:

io_op(Stream& next_layer, stream_core& core,
      const Operation& op, Handler& handler)
    : next_layer_(next_layer),
      core_(core),
      op_(op),
      start_(0),
      want_(engine::want_nothing),
      bytes_transferred_(0),
      handler_(ASIO_MOVE_CAST(Handler)(handler))
  {
  }